

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

int Gia_ManEncodeFanin(Gia_Man_t *p,int iLit)

{
  int iVar1;
  Gia_Obj_t *pObj;
  
  iVar1 = Abc_Lit2Var(iLit);
  pObj = Gia_ManObj(p,iVar1);
  if ((~*(ulong *)pObj & 0x1fffffff1fffffff) == 0) {
    iVar1 = 7;
  }
  else {
    iVar1 = Gia_ObjIsPi(p,pObj);
    if (iVar1 == 0) {
      if ((~*(uint *)pObj & 0x9fffffff) == 0) {
        iVar1 = 10;
      }
      else {
        iVar1 = Gia_ObjIsXor(pObj);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsMux(p,pObj);
          if (iVar1 == 0) {
            if (((int)(uint)*(undefined8 *)pObj < 0) ||
               (((uint)*(undefined8 *)pObj & 0x1fffffff) == 0x1fffffff)) {
              __assert_fail("Gia_ObjIsAnd(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                            ,0x2fa,"int Gia_ManEncodeFanin(Gia_Man_t *, int)");
            }
            iVar1 = 0xd;
          }
          else {
            iVar1 = 0xc;
          }
        }
        else {
          iVar1 = 0xb;
        }
      }
    }
    else {
      iVar1 = 9;
    }
  }
  return iVar1;
}

Assistant:

int Gia_ManEncodeFanin( Gia_Man_t * p, int iLit )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, Abc_Lit2Var(iLit) );
    if ( Gia_ObjIsConst0(pObj) )
        return iC0;
    if ( Gia_ObjIsPi(p, pObj) )
        return iPI;
    if ( Gia_ObjIsCi(pObj) )
        return iFF;
    if ( Gia_ObjIsXor(pObj) )
        return iXOR;
    if ( Gia_ObjIsMux(p, pObj) )
        return iMUX;
    assert( Gia_ObjIsAnd(pObj) );
    return iAND;
//    if ( Abc_LitIsCompl(iLit) )
//        return iANDn;
//    else
//        return iANDp;
}